

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3813.cpp
# Opt level: O3

void __thiscall
chrono::fea::BrickGravity::BrickGravity
          (BrickGravity *this,ChMatrixNM<double,_8,_3> *d0_,ChElementHexaANCF_3813 *element_)

{
  (this->super_ChIntegrable3D<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>)._vptr_ChIntegrable3D =
       (_func_int **)&PTR__ChIntegrable3D_00b35858;
  this->element = element_;
  this->d0 = d0_;
  return;
}

Assistant:

BrickGravity::BrickGravity(ChMatrixNM<double, 8, 3>* d0_, ChElementHexaANCF_3813* element_)
    : element(element_), d0(d0_) {}